

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

Privkey * cfd::core::Privkey::GenerageRandomKey(void)

{
  size_type priv_key_len;
  Privkey *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff70;
  ByteData local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  int local_2c;
  undefined1 local_28 [4];
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> privkey;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4735d3);
  local_2c = 0;
  do {
    RandomNumberUtil::GetRandomBytes(&local_48,0x20);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,&local_48);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_ffffffffffffff70)
    ;
    in_stack_ffffffffffffff70 =
         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
         ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x47361d);
    priv_key_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
    local_2c = wally_ec_private_key_verify((uchar *)in_stack_ffffffffffffff70,priv_key_len);
  } while (local_2c != 0);
  ByteData::ByteData(&local_70,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  Privkey(in_RDI,&local_70,kMainnet,true);
  ByteData::~ByteData((ByteData *)0x47367e);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_ffffffffffffff70);
  return in_RDI;
}

Assistant:

Privkey Privkey::GenerageRandomKey() {
  std::vector<uint8_t> privkey;
  int ret = WALLY_OK;

  do {
    privkey = RandomNumberUtil::GetRandomBytes(kPrivkeySize);
    ret = wally_ec_private_key_verify(privkey.data(), privkey.size());
  } while (ret != WALLY_OK);

  return Privkey(ByteData(privkey));
}